

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerCheckUpperIntBound(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  LabelInstr *target;
  LabelInstr *target_00;
  Opnd *pOVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  Instr *instr_00;
  Instr *local_60;
  Instr *helperCallInstr;
  LabelInstr *helperLabel;
  LabelInstr *continueLabel;
  Instr *lowerBoundCheckInstr;
  Instr *instrPrev;
  bool lowerBoundCheckPresent;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr->m_prev->m_opcode == CheckLowerIntBound) {
    pIVar1 = instr->m_prev->m_prev;
    local_60 = instr->m_prev;
  }
  else {
    pIVar1 = instr->m_prev;
    local_60 = (Instr *)0x0;
  }
  target = IR::LabelInstr::New(Label,instr->m_func,false);
  target_00 = IR::LabelInstr::New(Label,instr->m_func,true);
  pOVar4 = IR::Instr::GetSrc1(instr);
  bVar3 = IR::Opnd::IsInt32(pOVar4);
  if (!bVar3) {
    pOVar4 = IR::Instr::GetSrc1(instr);
    bVar3 = IR::Opnd::IsUInt32(pOVar4);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x71e8,"(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32())",
                         "instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  if (local_60 == (Instr *)0x0) {
    pOVar4 = IR::Instr::UnlinkSrc1(instr);
    pOVar6 = IR::Instr::UnlinkSrc2(instr);
    InsertCompareBranch(this,pOVar4,pOVar6,BrLe_A,target,instr,false);
  }
  else {
    pOVar4 = IR::Instr::UnlinkSrc1(instr);
    pOVar6 = IR::Instr::UnlinkSrc2(instr);
    InsertCompareBranch(this,pOVar4,pOVar6,BrGt_A,target_00,instr,false);
    pOVar4 = IR::Instr::GetSrc1(local_60);
    bVar3 = IR::Opnd::IsInt32(pOVar4);
    if (!bVar3) {
      pOVar4 = IR::Instr::GetSrc1(local_60);
      bVar3 = IR::Opnd::IsUInt32(pOVar4);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x71ed,
                           "(lowerBoundCheckInstr->GetSrc1()->IsInt32() || lowerBoundCheckInstr->GetSrc1()->IsUInt32())"
                           ,
                           "lowerBoundCheckInstr->GetSrc1()->IsInt32() || lowerBoundCheckInstr->GetSrc1()->IsUInt32()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    pOVar4 = IR::Instr::UnlinkSrc1(local_60);
    pOVar6 = IR::Instr::UnlinkSrc2(local_60);
    InsertCompareBranch(this,pOVar4,pOVar6,BrGe_A,target,instr,false);
  }
  IR::Instr::InsertBefore(instr,&target_00->super_Instr);
  instr_00 = IR::Instr::New(CALL,instr->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr_00,HelperIntRangeCheckFailure,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  IR::Instr::Remove(instr);
  if (local_60 != (Instr *)0x0) {
    IR::Instr::Remove(local_60);
  }
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::LowerCheckUpperIntBound(IR::Instr * instr)
{
    bool lowerBoundCheckPresent = instr->m_prev->m_opcode == Js::OpCode::CheckLowerIntBound;
    IR::Instr * instrPrev = lowerBoundCheckPresent ? instr->m_prev->m_prev : instr->m_prev;

    IR::Instr * lowerBoundCheckInstr = lowerBoundCheckPresent ? instr->m_prev : nullptr;

    IR::LabelInstr * continueLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, false /*isOpHelper*/);
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, true /*isOpHelper*/);

    Assert(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32());
    if (lowerBoundCheckInstr)
    {
        InsertCompareBranch(instr->UnlinkSrc1(), instr->UnlinkSrc2(), Js::OpCode::BrGt_A, helperLabel, instr);

        Assert(lowerBoundCheckInstr->GetSrc1()->IsInt32() || lowerBoundCheckInstr->GetSrc1()->IsUInt32());
        InsertCompareBranch(lowerBoundCheckInstr->UnlinkSrc1(), lowerBoundCheckInstr->UnlinkSrc2(), Js::OpCode::BrGe_A, continueLabel, instr);
    }
    else
    {
        InsertCompareBranch(instr->UnlinkSrc1(), instr->UnlinkSrc2(), Js::OpCode::BrLe_A, continueLabel, instr);
    }

    instr->InsertBefore(helperLabel);
    IR::Instr* helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    instr->InsertBefore(helperCallInstr);
    m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::HelperIntRangeCheckFailure);

    instr->InsertAfter(continueLabel);

    instr->Remove();
    if (lowerBoundCheckInstr)
    {
        lowerBoundCheckInstr->Remove();
    }

    return instrPrev;
}